

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.c
# Opt level: O2

_Bool is_same_type(json_value *value,config_item *item)

{
  if (value != (json_value *)0x0) {
    switch(value->type) {
    case json_object:
      if (item->type == cdt_object) {
        return true;
      }
      break;
    case json_array:
      return item->list;
    case json_integer:
      if (item->type == cdt_int) {
        return true;
      }
      if ((item->type == cdt_uint16) && ((ulong)(value->u).integer < 0x10000)) {
        return true;
      }
      break;
    case json_double:
      if (item->type == cdt_double) {
        return true;
      }
      break;
    case json_string:
      if (item->type == cdt_string) {
        return true;
      }
      break;
    case json_boolean:
      if (item->type == cdt_bool) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool is_same_type(json_value * value, config_item * item)
{
    if (value == NULL || item == NULL)
        return false;

    return (value->type == json_boolean && item->type == cdt_bool)
        || (value->type == json_integer && item->type == cdt_uint16
            && value->u.integer >=0 && value->u.integer < 0x10000)
        || (value->type == json_integer && item->type == cdt_int)
        || (value->type == json_double && item->type == cdt_double)
        || (value->type == json_string && item->type == cdt_string)
        || (value->type == json_object && item->type == cdt_object)
        || (value->type == json_array && item->list == true);
}